

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMeshControl::DefinePartitionbyCoarseIndices(TPZMHMeshControl *this,TPZVec<long> *coarseindices)

{
  long *plVar1;
  int64_t iel;
  int64_t in_RAX;
  TPZGeoEl *pTVar2;
  mapped_type_conflict *pmVar3;
  long lVar4;
  int64_t newsize;
  int64_t el;
  long lVar5;
  int64_t local_38;
  
  lVar5 = coarseindices->fNElements;
  newsize = (((this->fGMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.
            fNElements;
  local_38 = in_RAX;
  TPZManVector<long,_10>::Resize(&this->fGeoToMHMDomain,newsize);
  plVar1 = (this->fGeoToMHMDomain).super_TPZVec<long>.fStore;
  lVar4 = 0;
  if (newsize < 1) {
    newsize = lVar4;
  }
  for (; newsize != lVar4; lVar4 = lVar4 + 1) {
    plVar1[lVar4] = -1;
  }
  lVar4 = 0;
  if (lVar5 < 1) {
    lVar5 = lVar4;
  }
  for (; lVar5 != lVar4; lVar4 = lVar4 + 1) {
    iel = coarseindices->fStore[lVar4];
    (this->fGeoToMHMDomain).super_TPZVec<long>.fStore[iel] = iel;
    pTVar2 = TPZGeoMesh::Element(((this->fGMesh).fRef)->fPointer,iel);
    if (pTVar2 != (TPZGeoEl *)0x0) {
      local_38 = pTVar2->fIndex;
      pmVar3 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[](&this->fMHMtoSubCMesh,&local_38);
      *pmVar3 = -1;
    }
  }
  lVar5 = 0;
  do {
    if (lVar5 == newsize) {
      (*this->_vptr_TPZMHMeshControl[5])(this);
      return;
    }
    pTVar2 = TPZGeoMesh::Element(((this->fGMesh).fRef)->fPointer,lVar5);
    if ((pTVar2 != (TPZGeoEl *)0x0) &&
       ((this->fGeoToMHMDomain).super_TPZVec<long>.fStore[lVar5] == -1)) {
      do {
        pTVar2 = TPZGeoEl::Father(pTVar2);
        if (pTVar2 == (TPZGeoEl *)0x0) goto LAB_011e3954;
        plVar1 = (this->fGeoToMHMDomain).super_TPZVec<long>.fStore;
        lVar4 = plVar1[pTVar2->fIndex];
      } while (lVar4 == -1);
      plVar1[lVar5] = lVar4;
    }
LAB_011e3954:
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void TPZMHMeshControl::DefinePartitionbyCoarseIndices(TPZVec<int64_t> &coarseindices)
{
    int64_t ncoarse = coarseindices.size();
    int64_t nel = fGMesh->NElements();
    fGeoToMHMDomain.Resize(nel);
    for (int64_t el=0; el<nel; el++) {
        fGeoToMHMDomain[el] = -1;
    }
    for (int64_t el=0; el<ncoarse; el++) {
        fGeoToMHMDomain[coarseindices[el]] = coarseindices[el];
        TPZGeoEl *gel = fGMesh->Element(coarseindices[el]);
        if (gel) {
            fMHMtoSubCMesh[gel->Index()] = -1;
        }
    }
    // set the MHM domain index for all elements
    // look for a father element that has a MHM domain index
    // adopt the domain index of the ancester
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (!gel || fGeoToMHMDomain[el] != -1) {
            continue;
        }
        int domain = -1;
        TPZGeoEl *father = gel->Father();
        while (father) {
            int64_t index = father->Index();
            if (fGeoToMHMDomain[index] != -1) {
                fGeoToMHMDomain[el] = fGeoToMHMDomain[index];
                break;
            }
            father = father->Father();
        }
    }
    CreateSkeletonElements();
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "Subdomain indices " << fGeoToMHMDomain << std::endl;
        sout << "Recognized domains ";
        for (auto it = fMHMtoSubCMesh.begin(); it != fMHMtoSubCMesh.end(); it++) {
            sout << it->first << ' ';
        }
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
}